

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

void __thiscall
helics::InputInfo::disconnectFederate(InputInfo *this,GlobalFederateId fedToDisconnect,Time minTime)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  reference pvVar3;
  baseType in_RDX;
  BaseType in_ESI;
  long in_RDI;
  size_t ii;
  ulong local_20;
  TimeRepresentation<count_time<9,_long>_> local_10;
  GlobalFederateId local_4;
  
  local_10.internalTimeCode = in_RDX;
  local_4.gid = in_ESI;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e0d88);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4e0d99);
  for (local_20 = 0;
      sVar2 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                        ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                         (in_RDI + 0xb0)), local_20 < sVar2; local_20 = local_20 + 1) {
    this_00 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::operator[]
                        ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                         (in_RDI + 0xb0),local_20);
    bVar1 = GlobalFederateId::operator==(&this_00->fed_id,local_4);
    if (bVar1) {
      pvVar3 = std::
               vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
               ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                             *)(in_RDI + 200),local_20);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_10,pvVar3);
      if (bVar1) {
        pvVar3 = std::
                 vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                               *)(in_RDI + 200),local_20);
        pvVar3->internalTimeCode = local_10.internalTimeCode;
      }
    }
  }
  return;
}

Assistant:

void InputInfo::disconnectFederate(GlobalFederateId fedToDisconnect, Time minTime)
{
    // the inputUnits and type are not determined anymore since the source list has changed
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < input_sources.size(); ++ii) {
        if (input_sources[ii].fed_id == fedToDisconnect) {
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}